

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

UNumberSignDisplay icu_63::number::impl::stem_to_object::signDisplay(StemEnum stem)

{
  UNumberSignDisplay local_c;
  StemEnum stem_local;
  
  switch(stem) {
  case STEM_SIGN_AUTO:
    local_c = UNUM_SIGN_AUTO;
    break;
  case STEM_SIGN_ALWAYS:
    local_c = UNUM_SIGN_ALWAYS;
    break;
  case STEM_SIGN_NEVER:
    local_c = UNUM_SIGN_NEVER;
    break;
  case STEM_SIGN_ACCOUNTING:
    local_c = UNUM_SIGN_ACCOUNTING;
    break;
  case STEM_SIGN_ACCOUNTING_ALWAYS:
    local_c = UNUM_SIGN_ACCOUNTING_ALWAYS;
    break;
  case STEM_SIGN_EXCEPT_ZERO:
    local_c = UNUM_SIGN_EXCEPT_ZERO;
    break;
  case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
    local_c = UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO;
    break;
  default:
    local_c = UNUM_SIGN_COUNT;
  }
  return local_c;
}

Assistant:

UNumberSignDisplay stem_to_object::signDisplay(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_SIGN_AUTO:
            return UNUM_SIGN_AUTO;
        case STEM_SIGN_ALWAYS:
            return UNUM_SIGN_ALWAYS;
        case STEM_SIGN_NEVER:
            return UNUM_SIGN_NEVER;
        case STEM_SIGN_ACCOUNTING:
            return UNUM_SIGN_ACCOUNTING;
        case STEM_SIGN_ACCOUNTING_ALWAYS:
            return UNUM_SIGN_ACCOUNTING_ALWAYS;
        case STEM_SIGN_EXCEPT_ZERO:
            return UNUM_SIGN_EXCEPT_ZERO;
        case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
            return UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO;
        default:
            return UNUM_SIGN_COUNT; // for objects, throw; for enums, return COUNT
    }
}